

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

void __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::RegisterImports
          (NimBfbsGenerator *this,Object *object,Field *field,bool use_element)

{
  pointer __position;
  __type _Var1;
  BaseType BVar2;
  Type *pTVar3;
  char *pcVar4;
  Object *this_00;
  String *pSVar5;
  Enum *this_01;
  undefined7 in_register_00000009;
  string *importns_00;
  int __c;
  int __c_00;
  size_t i;
  ulong uVar6;
  pointer pcVar7;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str2_vec;
  string ns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relative_to_vec;
  string type_name;
  string import_path;
  string importns;
  allocator<char> local_1a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  undefined1 local_190 [32];
  string local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  value_type local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  pcVar4 = (char *)0x0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_138.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000009,use_element) == 0) {
    pTVar3 = reflection::Field::type(field);
    BVar2 = reflection::Type::base_type(pTVar3);
  }
  else {
    pTVar3 = reflection::Field::type(field);
    BVar2 = reflection::Type::element(pTVar3);
  }
  if (BVar2 == Obj) {
    pTVar3 = reflection::Field::type(field);
    pcVar4 = reflection::Type::index(pTVar3,pcVar4,__c);
    this_00 = BaseBfbsGenerator::GetObjectByIndex(&this->super_BaseBfbsGenerator,(int32_t)pcVar4);
    if (this_00 == this->current_obj_) goto LAB_00241bda;
    local_190._0_8_ = local_190 + 0x10;
    local_190._8_8_ = (pointer)0x0;
    local_190[0x10] = '\0';
    pSVar5 = reflection::Object::name(this_00);
    String::str_abi_cxx11_((string *)local_118,pSVar5);
    importns_00 = &local_b0;
    Denamespace(&local_170,this,(string *)local_118,importns_00,(string *)local_190);
    std::__cxx11::string::operator=((string *)&local_138,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)local_118);
    pcVar7 = (pointer)local_190._8_8_;
    if ((pointer)local_190._8_8_ == (pointer)0x0) {
      std::__cxx11::string::string((string *)&local_170,(string *)&local_138);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_118 + 0x28),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     ".");
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_118 + 0x28),&local_138);
    }
  }
  else {
    pTVar3 = reflection::Field::type(field);
    pcVar4 = reflection::Type::index(pTVar3,pcVar4,__c_00);
    this_01 = BaseBfbsGenerator::GetEnumByIndex(&this->super_BaseBfbsGenerator,(int32_t)pcVar4);
    if (this_01 == this->current_enum_) goto LAB_00241bda;
    local_190._0_8_ = local_190 + 0x10;
    local_190._8_8_ = (pointer)0x0;
    local_190[0x10] = '\0';
    pSVar5 = reflection::Enum::name(this_01);
    String::str_abi_cxx11_((string *)local_118,pSVar5);
    importns_00 = &local_b0;
    Denamespace(&local_170,this,(string *)local_118,importns_00,(string *)local_190);
    std::__cxx11::string::operator=((string *)&local_138,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)local_118);
    pcVar7 = (pointer)local_190._8_8_;
    if ((pointer)local_190._8_8_ == (pointer)0x0) {
      std::__cxx11::string::string((string *)&local_170,(string *)&local_138);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_118 + 0x28),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     ".");
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_118 + 0x28),&local_138);
    }
  }
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  if (pcVar7 != (pointer)0x0) {
    std::__cxx11::string::~string((string *)(local_118 + 0x28));
  }
  std::__cxx11::string::~string((string *)local_190);
  pSVar5 = reflection::Object::name(object);
  String::str_abi_cxx11_(&local_90,pSVar5);
  std::__cxx11::string::string((string *)local_190,(string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,".",(allocator<char> *)local_118);
  StringSplit(&local_150,(NimBfbsGenerator *)local_190,&local_170,importns_00);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::string((string *)local_118,(string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,".",(allocator<char> *)&local_50);
  StringSplit(&local_1a8,(NimBfbsGenerator *)local_118,&local_70,importns_00);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_118);
  while (((local_150.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_150.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start &&
          (local_1a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_1a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)) &&
         (_Var1 = std::operator==(local_150.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  local_1a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start), _Var1))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&local_150,
            (const_iterator)
            local_150.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&local_1a8,
            (const_iterator)
            local_1a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
  }
  local_150.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_150.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  local_118._32_8_ = this;
  std::__cxx11::string::~string
            ((string *)
             local_150.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  for (uVar6 = 0;
      __position = local_1a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)local_150.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_150.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"..",&local_1a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&local_1a8,(const_iterator)__position,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  for (uVar6 = 0;
      uVar6 < (ulong)((long)local_1a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
    std::__cxx11::string::append((string *)&local_d0);
    if (uVar6 != ((long)local_1a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      std::__cxx11::string::append((char *)&local_d0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  std::__cxx11::string::~string((string *)&local_90);
  local_190[0] = 0x2e;
  local_170._M_dataplus._M_p._0_1_ = '_';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_138._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_138._M_dataplus._M_p + (long)(_Hash_node_base **)local_138._M_string_length),
             local_190,(char *)&local_170);
  RegisterImports((NimBfbsGenerator *)local_118._32_8_,&local_d0,&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
LAB_00241bda:
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void RegisterImports(const r::Object *object, const r::Field *field,
                       bool use_element = false) {
    std::string importns;
    std::string type_name;

    const r::BaseType type =
        use_element ? field->type()->element() : field->type()->base_type();

    if (IsStructOrTable(type)) {
      const r::Object *object_def = GetObjectByIndex(field->type()->index());
      if (object_def == current_obj_) { return; }
      std::string ns;
      type_name = Denamespace(object_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    } else {
      const r::Enum *enum_def = GetEnumByIndex(field->type()->index());
      if (enum_def == current_enum_) { return; }
      std::string ns;
      type_name = Denamespace(enum_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    }

    std::string import_path =
        GetRelativePathFromNamespace(object->name()->str(), type_name);
    std::replace(type_name.begin(), type_name.end(), '.', '_');
    RegisterImports(import_path, importns);
  }